

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O1

int64_t __thiscall
aeron::archive::AeronArchive::startRecording
          (AeronArchive *this,string *channel,int32_t streamId,Value sourceLocation)

{
  int64_t iVar1;
  Value local_50;
  int32_t local_4c;
  _Any_data local_48;
  code *local_38;
  code *pcStack_30;
  
  local_38 = (code *)0x0;
  pcStack_30 = (code *)0x0;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_50 = sourceLocation;
  local_4c = streamId;
  local_48._M_unused._M_object = operator_new(0x20);
  *(AeronArchive **)local_48._M_unused._0_8_ = this;
  *(string **)((long)local_48._M_unused._0_8_ + 8) = channel;
  *(int32_t **)((long)local_48._M_unused._0_8_ + 0x10) = &local_4c;
  *(Value **)((long)local_48._M_unused._0_8_ + 0x18) = &local_50;
  pcStack_30 = std::
               _Function_handler<bool_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp:156:9)>
               ::_M_invoke;
  local_38 = std::
             _Function_handler<bool_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp:156:9)>
             ::_M_manager;
  iVar1 = callAndPollForResponse(this,(function<bool_(long)> *)&local_48,"start recording");
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  return iVar1;
}

Assistant:

std::int64_t AeronArchive::startRecording(const std::string& channel, std::int32_t streamId,
                                          codecs::SourceLocation::Value sourceLocation) {
    return callAndPollForResponse(
        [&](std::int64_t correlationId) {
            return archiveProxy_->startRecording(channel, streamId, sourceLocation, correlationId, controlSessionId_);
        },
        "start recording");
}